

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestEnd(StreamingListener *this,TestInfo *test_info)

{
  bool value;
  TestResult *pTVar1;
  TimeInMillis local_f0;
  string local_e8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  TestInfo *local_18;
  TestInfo *test_info_local;
  StreamingListener *this_local;
  
  local_18 = test_info;
  test_info_local = (TestInfo *)this;
  pTVar1 = TestInfo::result(test_info);
  value = TestResult::Passed(pTVar1);
  FormatBool_abi_cxx11_(&local_b8,this,value);
  std::operator+(&local_98,"event=TestEnd&passed=",&local_b8);
  std::operator+(&local_78,&local_98,"&elapsed_time=");
  pTVar1 = TestInfo::result(local_18);
  local_f0 = TestResult::elapsed_time(pTVar1);
  StreamableToString<long>(&local_e8,&local_f0);
  std::operator+(&local_58,&local_78,&local_e8);
  std::operator+(&local_38,&local_58,"ms");
  SendLn(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void OnTestEnd(const TestInfo& test_info) override {
    SendLn("event=TestEnd&passed=" +
           FormatBool((test_info.result())->Passed()) +
           "&elapsed_time=" +
           StreamableToString((test_info.result())->elapsed_time()) + "ms");
  }